

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sv.c
# Opt level: O2

int control(char *a)

{
  int iVar1;
  uint uVar2;
  ssize_t sVar3;
  int *piVar4;
  char *m1;
  
  iVar1 = svstatus_get();
  if (0 < iVar1) {
    if (svstatus[0x11] == *a) {
      if (svstatus[0x11] != 'd') {
        return 0;
      }
      if (svstatus[0x12] == '\x01') {
        return 0;
      }
    }
    iVar1 = open_write("supervise/control");
    fd = iVar1;
    if (iVar1 == -1) {
      piVar4 = __errno_location();
      if (*piVar4 == error_nodevice) {
        if (*a == 'x') {
          ok("runsv not running");
          return -1;
        }
        failx("runsv not running");
        return -1;
      }
      m1 = "unable to open supervise/control";
    }
    else {
      uVar2 = str_len(a);
      sVar3 = write(iVar1,a,(ulong)uVar2);
      r = (int)sVar3;
      close(fd);
      iVar1 = r;
      uVar2 = str_len(a);
      if (iVar1 == uVar2) {
        return 1;
      }
      m1 = "unable to write to supervise/control";
    }
    warn(m1);
  }
  return -1;
}

Assistant:

int control(char *a) {
  if (svstatus_get() <= 0) return(-1);
  if (svstatus[17] == *a)
    if (*a != 'd' || svstatus[18] == 1) return(0); /* once w/o term */
  if ((fd =open_write("supervise/control")) == -1) {
    if (errno != error_nodevice)
      warn("unable to open supervise/control");
    else
      *a == 'x' ? ok("runsv not running") : failx("runsv not running");
    return(-1);
  }
  r =write(fd, a, str_len(a));
  close(fd);
  if (r != str_len(a)) {
    warn("unable to write to supervise/control");
    return(-1);
  }
  return(1);
}